

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O2

vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collections,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collections_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collections_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collections_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *collections_4)

{
  initializer_list<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  pointer local_10;
  
  local_58 = (collections->_M_dataplus)._M_p;
  local_50 = local_58 + collections->_M_string_length;
  local_48 = (collections_1->_M_dataplus)._M_p;
  local_40 = local_48 + collections_1->_M_string_length;
  local_38 = (collections_2->_M_dataplus)._M_p;
  local_30 = local_38 + collections_2->_M_string_length;
  local_28 = (collections_3->_M_dataplus)._M_p;
  local_20 = local_28 + collections_3->_M_string_length;
  local_18 = (collections_4->_M_dataplus)._M_p;
  local_10 = local_18 + collections_4->_M_string_length;
  values._M_len = (size_type)local_18;
  values._M_array = (iterator)0x5;
  make_sequence_container<std::vector,_boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            (__return_storage_ptr__,(burst *)&local_58,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }